

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OscReceivedElements.cpp
# Opt level: O2

float __thiscall osc::ReceivedMessageArgument::AsFloat(ReceivedMessageArgument *this)

{
  undefined8 *puVar1;
  pointer_____offset_0x10___ *ppuVar2;
  float fVar3;
  
  if (this->typeTagPtr_ == (char *)0x0) {
    puVar1 = (undefined8 *)__cxa_allocate_exception(0x10);
    puVar1[1] = "missing argument";
    *puVar1 = &PTR__exception_0019fc98;
    ppuVar2 = &MissingArgumentException::typeinfo;
  }
  else {
    if (*this->typeTagPtr_ == 'f') {
      fVar3 = AsFloatUnchecked(this);
      return fVar3;
    }
    puVar1 = (undefined8 *)__cxa_allocate_exception(0x10);
    puVar1[1] = "wrong argument type";
    *puVar1 = &PTR__exception_0019fcc0;
    ppuVar2 = &WrongArgumentTypeException::typeinfo;
  }
  __cxa_throw(puVar1,ppuVar2,std::exception::~exception);
}

Assistant:

float ReceivedMessageArgument::AsFloat() const
{
    if( !typeTagPtr_ )
        throw MissingArgumentException();
	else if( *typeTagPtr_ == FLOAT_TYPE_TAG )
		return AsFloatUnchecked();
	else
		throw WrongArgumentTypeException();
}